

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_io.hpp
# Opt level: O2

Lazy<std::pair<std::error_code,_unsigned_long>_> __thiscall
coro_io::
async_read<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::basic_streambuf<std::allocator<char>>>
          (coro_io *this,basic_stream_socket<asio::ip::tcp,_asio::any_io_executor> *socket,
          basic_streambuf<std::allocator<char>_> *buffer,size_t size_to_read)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)operator_new(0xb0,(nothrow_t *)&std::nothrow);
  if (puVar1 == (undefined8 *)0x0) {
    *(undefined8 *)this = 0;
  }
  else {
    *puVar1 = 
    async_read<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::basic_streambuf<std::allocator<char>>>
    ;
    puVar1[1] = 
    async_read<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::basic_streambuf<std::allocator<char>>>
    ;
    puVar1[0x14] = buffer;
    puVar1[0x13] = socket;
    puVar1[0x12] = size_to_read;
    puVar1[2] = 0;
    puVar1[3] = 0;
    puVar1[4] = 0;
    *(undefined1 *)(puVar1 + 8) = 0;
    *(undefined8 **)this = puVar1;
    *(undefined1 *)(puVar1 + 0x15) = 0;
  }
  return (LazyBase<std::pair<std::error_code,_unsigned_long>,_false>)
         (LazyBase<std::pair<std::error_code,_unsigned_long>,_false>)this;
}

Assistant:

inline async_simple::coro::Lazy<std::pair<std::error_code, size_t>> async_read(
    Socket &socket, AsioBuffer &buffer, size_t size_to_read) noexcept {
  callback_awaitor<std::pair<std::error_code, size_t>> awaitor;
  co_return co_await awaitor.await_resume([&](auto handler) {
    asio::async_read(socket, buffer, asio::transfer_exactly(size_to_read),
                     [&, handler](const auto &ec, auto size) {
                       handler.set_value_then_resume(ec, size);
                     });
  });
}